

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlStatus htmlAttrAllowed(htmlElemDesc *elt,xmlChar *attr,int legacy)

{
  int iVar1;
  char **local_30;
  char **p;
  int legacy_local;
  xmlChar *attr_local;
  htmlElemDesc *elt_local;
  
  if ((elt != (htmlElemDesc *)0x0) && (attr != (xmlChar *)0x0)) {
    if (elt->attrs_req != (char **)0x0) {
      for (local_30 = elt->attrs_req; *local_30 != (char *)0x0; local_30 = local_30 + 1) {
        iVar1 = xmlStrcmp((xmlChar *)*local_30,attr);
        if (iVar1 == 0) {
          return HTML_REQUIRED;
        }
      }
    }
    if (elt->attrs_opt != (char **)0x0) {
      for (local_30 = elt->attrs_opt; *local_30 != (char *)0x0; local_30 = local_30 + 1) {
        iVar1 = xmlStrcmp((xmlChar *)*local_30,attr);
        if (iVar1 == 0) {
          return HTML_VALID;
        }
      }
    }
    if ((legacy != 0) && (elt->attrs_depr != (char **)0x0)) {
      for (local_30 = elt->attrs_depr; *local_30 != (char *)0x0; local_30 = local_30 + 1) {
        iVar1 = xmlStrcmp((xmlChar *)*local_30,attr);
        if (iVar1 == 0) {
          return HTML_DEPRECATED;
        }
      }
    }
  }
  return HTML_INVALID;
}

Assistant:

htmlStatus
htmlAttrAllowed(const htmlElemDesc* elt, const xmlChar* attr, int legacy) {
  const char** p ;

  if ( !elt || ! attr )
	return HTML_INVALID ;

  if ( elt->attrs_req )
    for ( p = elt->attrs_req; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_REQUIRED ;

  if ( elt->attrs_opt )
    for ( p = elt->attrs_opt; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_VALID ;

  if ( legacy && elt->attrs_depr )
    for ( p = elt->attrs_depr; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_DEPRECATED ;

  return HTML_INVALID ;
}